

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdbusmenuconnection_p.cpp
# Opt level: O3

void QDBusMenuConnection::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  if (_c == IndexOfMethod) {
    if ((*_a[1] == trayIconRegistered) && (*(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
      return;
    }
  }
  else if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      QMetaObject::activate(_o,&staticMetaObject,0,(void **)0x0);
      return;
    }
    if (_id == 1) {
      dbusError((QDBusMenuConnection *)_o,(QDBusError *)_a[1]);
      return;
    }
  }
  return;
}

Assistant:

void QDBusMenuConnection::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDBusMenuConnection *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->trayIconRegistered(); break;
        case 1: _t->dbusError((*reinterpret_cast< std::add_pointer_t<QDBusError>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDBusMenuConnection::*)()>(_a, &QDBusMenuConnection::trayIconRegistered, 0))
            return;
    }
}